

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

void Curl_http2_cleanup_dependencies(Curl_easy *data)

{
  undefined1 *puVar1;
  Curl_easy *pCVar2;
  Curl_easy *parent;
  Curl_http2_dep *pCVar3;
  Curl_http2_dep *pCVar4;
  Curl_http2_dep *pCVar5;
  Curl_http2_dep *pCVar6;
  
  pCVar5 = (data->set).stream_dependents;
  while (pCVar5 != (Curl_http2_dep *)0x0) {
    pCVar2 = pCVar5->data;
    (data->set).stream_dependents = pCVar5->next;
    (*Curl_cfree)(pCVar5);
    (pCVar2->set).stream_depends_on = (Curl_easy *)0x0;
    puVar1 = &(pCVar2->set).field_0x8e2;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffdfffffffffff;
    parent = (data->set).stream_depends_on;
    if (parent != (Curl_easy *)0x0) {
      Curl_http2_add_child(parent,pCVar2,false);
    }
    pCVar5 = (data->set).stream_dependents;
  }
  pCVar2 = (data->set).stream_depends_on;
  if (pCVar2 != (Curl_easy *)0x0) {
    pCVar4 = (Curl_http2_dep *)&(pCVar2->set).stream_dependents;
    pCVar5 = pCVar4;
    pCVar3 = (Curl_http2_dep *)0x0;
    do {
      pCVar6 = pCVar3;
      pCVar5 = pCVar5->next;
      if (pCVar5 == (Curl_http2_dep *)0x0) goto LAB_0010be99;
      pCVar3 = pCVar5;
    } while (pCVar5->data != data);
    if (pCVar6 != (Curl_http2_dep *)0x0) {
      pCVar4 = pCVar6;
    }
    pCVar4->next = pCVar5->next;
    (*Curl_cfree)(pCVar5);
LAB_0010be99:
    (data->set).stream_depends_on = (Curl_easy *)0x0;
    puVar1 = &(data->set).field_0x8e2;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffdfffffffffff;
  }
  return;
}

Assistant:

void Curl_http2_cleanup_dependencies(struct Curl_easy *data)
{
  while(data->set.stream_dependents) {
    struct Curl_easy *tmp = data->set.stream_dependents->data;
    Curl_http2_remove_child(data, tmp);
    if(data->set.stream_depends_on)
      Curl_http2_add_child(data->set.stream_depends_on, tmp, FALSE);
  }

  if(data->set.stream_depends_on)
    Curl_http2_remove_child(data->set.stream_depends_on, data);
}